

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::busyWait(int milliseconds)

{
  deUint64 dVar1;
  deUint64 dVar2;
  int iVar3;
  undefined4 local_14;
  
  iVar3 = 0;
  local_14 = 2.0;
  dVar1 = deGetMicroseconds();
  do {
    for (; iVar3 != 10; iVar3 = iVar3 + 1) {
      local_14 = sinf(local_14);
    }
    dVar2 = deGetMicroseconds();
    iVar3 = 0;
  } while (dVar2 - dVar1 < 200000);
  return;
}

Assistant:

static void busyWait (int milliseconds)
{
	const deUint64	startTime	= deGetMicroseconds();
	float			v			= 2.0f;

	for (;;)
	{
		for (int i = 0; i < 10; i++)
			v = deFloatSin(v);

		if (deGetMicroseconds()-startTime >= deUint64(1000*milliseconds))
			break;
	}
}